

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xr_level_shaders.cxx
# Opt level: O0

void __thiscall
xray_re::xr_level_shaders::load(xr_level_shaders *this,uint32_t xrlc_version,xr_reader *r)

{
  xr_reader *local_28;
  xr_reader *s;
  xr_reader *r_local;
  xr_level_shaders *pxStack_10;
  uint32_t xrlc_version_local;
  xr_level_shaders *this_local;
  
  local_28 = (xr_reader *)0x0;
  s = r;
  r_local._4_4_ = xrlc_version;
  pxStack_10 = this;
  if (xrlc_version == 5) {
    local_28 = xr_reader::open_chunk(r,3);
    if (local_28 == (xr_reader *)0x0) {
      __assert_fail("s",
                    "/workspace/llm4binary/github/license_c_cmakelists/abramcumner[P]xray_re-tools/sources/xray_re/xr_level_shaders.cxx"
                    ,0x5a,"void xray_re::xr_level_shaders::load(uint32_t, xr_reader &)");
    }
    load_shaders_v5(this,local_28);
    xr_reader::close_chunk(s,&local_28);
    local_28 = xr_reader::open_chunk(s,2);
    if (local_28 == (xr_reader *)0x0) {
      __assert_fail("s",
                    "/workspace/llm4binary/github/license_c_cmakelists/abramcumner[P]xray_re-tools/sources/xray_re/xr_level_shaders.cxx"
                    ,0x5e,"void xray_re::xr_level_shaders::load(uint32_t, xr_reader &)");
    }
    load_textures_v5(this,local_28);
  }
  else if ((xrlc_version < 8) || (0xb < xrlc_version)) {
    if (0xb < xrlc_version) {
      local_28 = xr_reader::open_chunk(r,2);
      if (local_28 == (xr_reader *)0x0) {
        __assert_fail("s",
                      "/workspace/llm4binary/github/license_c_cmakelists/abramcumner[P]xray_re-tools/sources/xray_re/xr_level_shaders.cxx"
                      ,0x66,"void xray_re::xr_level_shaders::load(uint32_t, xr_reader &)");
      }
      load_v13(this,local_28);
    }
  }
  else {
    local_28 = xr_reader::open_chunk(r,2);
    if (local_28 == (xr_reader *)0x0) {
      __assert_fail("s",
                    "/workspace/llm4binary/github/license_c_cmakelists/abramcumner[P]xray_re-tools/sources/xray_re/xr_level_shaders.cxx"
                    ,0x62,"void xray_re::xr_level_shaders::load(uint32_t, xr_reader &)");
    }
    load_v8(this,local_28);
  }
  xr_reader::close_chunk(s,&local_28);
  return;
}

Assistant:

void xr_level_shaders::load(uint32_t xrlc_version, xr_reader& r)
{
	xr_reader* s = 0;
	if (xrlc_version == XRLC_VERSION_5) {
		s = r.open_chunk(FSL5_SHADERS);
		xr_assert(s);
		load_shaders_v5(*s);
		r.close_chunk(s);
		s = r.open_chunk(FSL5_TEXTURES);
		xr_assert(s);
		load_textures_v5(*s);
	} else if (xrlc_version >= XRLC_VERSION_8 && xrlc_version <= XRLC_VERSION_11) {
		s = r.open_chunk(FSL8_SHADERS);
		xr_assert(s);
		load_v8(*s);
	} else if (xrlc_version >= XRLC_VERSION_12) {
		s = r.open_chunk(FSL13_SHADERS);
		xr_assert(s);
		load_v13(*s);
	}
	r.close_chunk(s);
}